

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptArrays.cpp
# Opt level: O1

void __thiscall
GlobOpt::ArraySrcOpt::UpdateValue
          (ArraySrcOpt *this,StackSym *newHeadSegmentSym,StackSym *newHeadSegmentLengthSym,
          StackSym *newLengthSym)

{
  StackSym *pSVar1;
  code *pcVar2;
  bool bVar3;
  ObjectType OVar4;
  ObjectType OVar5;
  undefined4 *puVar6;
  ArrayValueInfo *pAVar7;
  
  OVar4 = ValueType::GetObjectType(&this->baseValueType);
  OVar5 = ValueType::GetObjectType(&this->newBaseValueType);
  if (OVar4 != OVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                       ,0xf5,"(baseValueType.GetObjectType() == newBaseValueType.GetObjectType())",
                       "baseValueType.GetObjectType() == newBaseValueType.GetObjectType()");
    if (!bVar3) goto LAB_00485e9a;
    *puVar6 = 0;
  }
  bVar3 = ValueType::IsObject(&this->newBaseValueType);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                       ,0xf6,"(newBaseValueType.IsObject())","newBaseValueType.IsObject()");
    if (!bVar3) goto LAB_00485e9a;
    *puVar6 = 0;
  }
  bVar3 = ValueType::IsLikelyArray(&this->baseValueType);
  if ((newLengthSym != (StackSym *)0x0) && (!bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                       ,0xf7,"(baseValueType.IsLikelyArray() || !newLengthSym)",
                       "baseValueType.IsLikelyArray() || !newLengthSym");
    if (!bVar3) goto LAB_00485e9a;
    *puVar6 = 0;
  }
  if ((newHeadSegmentSym == (StackSym *)0x0 && newHeadSegmentLengthSym == (StackSym *)0x0) &&
      newLengthSym == (StackSym *)0x0) {
    ChangeValueType(this->globOpt,this->globOpt->currentBlock,this->baseValue,
                    (ValueType)
                    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                     &(this->newBaseValueType).field_0.field_0,true,false);
    return;
  }
  pAVar7 = this->baseArrayValueInfo;
  if (pAVar7 != (ArrayValueInfo *)0x0) {
    if (newHeadSegmentSym == (StackSym *)0x0) {
      newHeadSegmentSym = pAVar7->headSegmentSym;
    }
    if (newHeadSegmentLengthSym == (StackSym *)0x0) {
      newHeadSegmentLengthSym = pAVar7->headSegmentLengthSym;
    }
    if (newLengthSym == (StackSym *)0x0) {
      newLengthSym = pAVar7->lengthSym;
    }
    if (newHeadSegmentSym != pAVar7->headSegmentSym && pAVar7->headSegmentSym != (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                         ,0x113,
                         "(!baseArrayValueInfo->HeadSegmentSym() || newHeadSegmentSym == baseArrayValueInfo->HeadSegmentSym())"
                         ,
                         "!baseArrayValueInfo->HeadSegmentSym() || newHeadSegmentSym == baseArrayValueInfo->HeadSegmentSym()"
                        );
      if (!bVar3) goto LAB_00485e9a;
      *puVar6 = 0;
    }
    pSVar1 = this->baseArrayValueInfo->headSegmentLengthSym;
    if ((pSVar1 != (StackSym *)0x0) && (newHeadSegmentLengthSym != pSVar1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                         ,0x114,
                         "(!baseArrayValueInfo->HeadSegmentLengthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym())"
                         ,
                         "!baseArrayValueInfo->HeadSegmentLengthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym()"
                        );
      if (!bVar3) goto LAB_00485e9a;
      *puVar6 = 0;
    }
    pSVar1 = this->baseArrayValueInfo->lengthSym;
    if ((pSVar1 != (StackSym *)0x0) && (newLengthSym != pSVar1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                         ,0x115,
                         "(!baseArrayValueInfo->LengthSym() || newLengthSym == baseArrayValueInfo->LengthSym())"
                         ,
                         "!baseArrayValueInfo->LengthSym() || newLengthSym == baseArrayValueInfo->LengthSym()"
                        );
      if (!bVar3) {
LAB_00485e9a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  pAVar7 = ArrayValueInfo::New(this->globOpt->alloc,
                               (ValueType)
                               *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                &(this->newBaseValueType).field_0.field_0,newHeadSegmentSym,
                               newHeadSegmentLengthSym,newLengthSym,this->baseValueInfo->symStore);
  ChangeValueInfo(this->globOpt,this->globOpt->currentBlock,this->baseValue,&pAVar7->super_ValueInfo
                  ,false,false);
  return;
}

Assistant:

void GlobOpt::ArraySrcOpt::UpdateValue(StackSym * newHeadSegmentSym, StackSym * newHeadSegmentLengthSym, StackSym * newLengthSym)
{
    Assert(baseValueType.GetObjectType() == newBaseValueType.GetObjectType());
    Assert(newBaseValueType.IsObject());
    Assert(baseValueType.IsLikelyArray() || !newLengthSym);

    if (!(newHeadSegmentSym || newHeadSegmentLengthSym || newLengthSym))
    {
        // We're not adding new information to the value other than changing the value type. Preserve any existing
        // information and just change the value type.
        globOpt->ChangeValueType(globOpt->currentBlock, baseValue, newBaseValueType, true);
        return;
    }

    // Merge the new syms into the value while preserving any existing information, and change the value type
    if (baseArrayValueInfo)
    {
        if (!newHeadSegmentSym)
        {
            newHeadSegmentSym = baseArrayValueInfo->HeadSegmentSym();
        }

        if (!newHeadSegmentLengthSym)
        {
            newHeadSegmentLengthSym = baseArrayValueInfo->HeadSegmentLengthSym();
        }

        if (!newLengthSym)
        {
            newLengthSym = baseArrayValueInfo->LengthSym();
        }

        Assert(!baseArrayValueInfo->HeadSegmentSym() || newHeadSegmentSym == baseArrayValueInfo->HeadSegmentSym());
        Assert(!baseArrayValueInfo->HeadSegmentLengthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym());
        Assert(!baseArrayValueInfo->LengthSym() || newLengthSym == baseArrayValueInfo->LengthSym());
    }

    ArrayValueInfo *const newBaseArrayValueInfo =
        ArrayValueInfo::New(
            globOpt->alloc,
            newBaseValueType,
            newHeadSegmentSym,
            newHeadSegmentLengthSym,
            newLengthSym,
            baseValueInfo->GetSymStore());

    globOpt->ChangeValueInfo(globOpt->currentBlock, baseValue, newBaseArrayValueInfo);
}